

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

bool __thiscall iDynTree::XMLParser::parseXMLString(XMLParser *this,string *xmlString)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  pointer this_00;
  xmlSAXHandlerPtr pxVar4;
  XMLParserState *this_01;
  undefined8 in_RDI;
  int result;
  XMLParserState *in_stack_ffffffffffffffd0;
  undefined1 local_15;
  
  xmlCheckVersion(0x51b1);
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1291f0);
  XMLParserState::resetState(in_stack_ffffffffffffffd0);
  this_00 = std::
            unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
            ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                          *)0x129209);
  pxVar4 = XMLParserPimpl::callbackHandler(this_00);
  this_01 = (XMLParserState *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::length();
  iVar3 = xmlSAXUserParseMemory(pxVar4,in_RDI,this_01,uVar2);
  local_15 = 0;
  if (iVar3 == 0) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x12925e);
    bVar1 = XMLParserState::getParsingErrorState(this_01);
    local_15 = bVar1 ^ 0xff;
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool XMLParser::parseXMLString(std::string xmlString)
    {
        assert(m_pimpl);
        LIBXML_TEST_VERSION

        // Reset the failure state.
        m_pimpl->m_parserState.resetState();

        // For now we do not support validation on the fly

        int result = xmlSAXUserParseMemory(m_pimpl->callbackHandler(), this, xmlString.c_str(), xmlString.length());
        return result == 0 && !m_pimpl->m_parserState.getParsingErrorState();
    }